

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Transaction::GetTxOutIndex(Transaction *this,Script *locking_script)

{
  ulong uVar1;
  int iVar2;
  CfdException *this_00;
  ulong unaff_RBP;
  pointer pTVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  string script;
  string search_str;
  string local_a8;
  string local_88;
  undefined1 local_68 [56];
  
  Script::GetHex_abi_cxx11_(&local_88,locking_script);
  pTVar3 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->vout_).
                          super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 4) *
      -0x33333333 != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      AbstractTxOut::GetLockingScript
                ((Script *)local_68,
                 (AbstractTxOut *)((long)&(pTVar3->super_AbstractTxOut)._vptr_AbstractTxOut + lVar5)
                );
      Script::GetHex_abi_cxx11_(&local_a8,(Script *)local_68);
      Script::~Script((Script *)local_68);
      if (local_a8._M_string_length == local_88._M_string_length) {
        if (local_a8._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_a8._M_dataplus._M_p,local_88._M_dataplus._M_p,local_a8._M_string_length
                      );
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      uVar1 = unaff_RBP;
      if (bVar6) {
        uVar1 = uVar4;
      }
      unaff_RBP = uVar1 & 0xffffffff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if (bVar6) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        return (uint32_t)uVar1;
      }
      uVar4 = uVar4 + 1;
      pTVar3 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x50;
    } while (uVar4 < (uint)((int)((ulong)((long)(this->vout_).
                                                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pTVar3) >> 4) * -0x33333333));
  }
  local_68._0_8_ = "cfdcore_transaction.cpp";
  local_68._8_4_ = 0x20e;
  local_68._16_8_ = (long)"CfdGetTxOutIndex" + 3;
  logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"locking script is not found.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"locking script is not found.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::GetTxOutIndex(const Script &locking_script) const {
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    std::string script = vout_[index].GetLockingScript().GetHex();
    if (script == search_str) {
      return index;
    }
  }
  warn(CFD_LOG_SOURCE, "locking script is not found.");
  throw CfdException(kCfdIllegalArgumentError, "locking script is not found.");
}